

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1512.c
# Opt level: O2

int test(char *URL)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  undefined8 uVar4;
  CURL *pCVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  undefined8 uStack_260;
  CURL *curl [2];
  char target_url [256];
  char dnsentry [256];
  
  pcVar2 = libtest_arg3;
  pcVar1 = libtest_arg2;
  curl[0] = (CURL *)0x0;
  curl[1] = (CURL *)0x0;
  iVar3 = curl_global_init(3);
  if (iVar3 == 0) {
    curl_msnprintf(dnsentry,0x100,"server.example.curl:%s:%s",pcVar2,pcVar1);
    curl_mprintf("%s\n",dnsentry);
    uVar4 = curl_slist_append(0,dnsentry);
    lVar9 = 0;
    do {
      if (lVar9 == 2) {
        iVar3 = curl_easy_setopt(curl[0],0x27db,uVar4);
        uVar7 = _stderr;
        if (iVar3 == 0) {
          uVar8 = 0;
          iVar3 = 0;
          while ((uVar8 < 2 && (iVar3 == 0))) {
            iVar3 = curl_easy_perform(curl[uVar8]);
            uVar8 = uVar8 + 1;
          }
        }
        else {
          uVar6 = curl_easy_strerror(iVar3);
          curl_mfprintf(uVar7,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1512.c"
                        ,0x4c,iVar3,uVar6);
        }
        goto LAB_001024cc;
      }
      pCVar5 = (CURL *)curl_easy_init();
      curl[lVar9] = pCVar5;
      if (pCVar5 == (CURL *)0x0) {
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1512.c"
                      ,0x3c);
        iVar3 = 0x7c;
        goto LAB_001024cc;
      }
      curl_msnprintf(target_url,0x100,"http://server.example.curl:%s/path/1512%04i",pcVar2,
                     (int)lVar9 + 1);
      target_url[0xff] = '\0';
      iVar3 = curl_easy_setopt(pCVar5,0x2712,target_url);
      uVar7 = _stderr;
      if (iVar3 != 0) {
        uVar6 = curl_easy_strerror(iVar3);
        uStack_260 = 0x42;
        goto LAB_001024b6;
      }
      iVar3 = curl_easy_setopt(pCVar5,0x29,1);
      uVar7 = _stderr;
      if (iVar3 != 0) {
        uVar6 = curl_easy_strerror(iVar3);
        uStack_260 = 0x44;
        goto LAB_001024b6;
      }
      iVar3 = curl_easy_setopt(pCVar5,0x2a,1);
      uVar7 = _stderr;
      if (iVar3 != 0) {
        uVar6 = curl_easy_strerror(iVar3);
        uStack_260 = 0x46;
        goto LAB_001024b6;
      }
      iVar3 = curl_easy_setopt(pCVar5,0x5b,1);
      uVar7 = _stderr;
      lVar9 = lVar9 + 1;
    } while (iVar3 == 0);
    uVar6 = curl_easy_strerror(iVar3);
    uStack_260 = 0x48;
LAB_001024b6:
    curl_mfprintf(uVar7,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1512.c"
                  ,uStack_260,iVar3,uVar6);
LAB_001024cc:
    curl_easy_cleanup(curl[0]);
    curl_easy_cleanup(curl[1]);
    curl_slist_free_all(uVar4);
    curl_global_cleanup();
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    iVar3 = 0x7e;
  }
  return iVar3;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl[NUM_HANDLES] = {NULL, NULL};
  char *port = libtest_arg3;
  char *address = libtest_arg2;
  char dnsentry[256];
  struct curl_slist *slist = NULL;
  int i;
  char target_url[256];
  (void)URL; /* URL is setup in the code */

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  msnprintf(dnsentry, sizeof(dnsentry), "server.example.curl:%s:%s",
            port, address);
  printf("%s\n", dnsentry);
  slist = curl_slist_append(slist, dnsentry);

  /* get NUM_HANDLES easy handles */
  for(i = 0; i < NUM_HANDLES; i++) {
    /* get an easy handle */
    easy_init(curl[i]);
    /* specify target */
    msnprintf(target_url, sizeof(target_url),
              "http://server.example.curl:%s/path/1512%04i",
              port, i + 1);
    target_url[sizeof(target_url) - 1] = '\0';
    easy_setopt(curl[i], CURLOPT_URL, target_url);
    /* go verbose */
    easy_setopt(curl[i], CURLOPT_VERBOSE, 1L);
    /* include headers */
    easy_setopt(curl[i], CURLOPT_HEADER, 1L);

    easy_setopt(curl[i], CURLOPT_DNS_USE_GLOBAL_CACHE, 1L);
  }

  /* make the first one populate the GLOBAL cache */
  easy_setopt(curl[0], CURLOPT_RESOLVE, slist);

  /* run NUM_HANDLES transfers */
  for(i = 0; (i < NUM_HANDLES) && !res; i++)
    res = curl_easy_perform(curl[i]);

test_cleanup:

  curl_easy_cleanup(curl[0]);
  curl_easy_cleanup(curl[1]);
  curl_slist_free_all(slist);
  curl_global_cleanup();

  return res;
}